

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O1

int32_t __thiscall
icu_63::Calendar::getActualMaximum(Calendar *this,UCalendarDateFields field,UErrorCode *status)

{
  int iVar1;
  int endValue;
  int32_t iVar2;
  Calendar *this_00;
  undefined4 extraout_var_00;
  ulong uVar3;
  int32_t unaff_EBP;
  uint uVar4;
  undefined4 extraout_var;
  
  if (UCAL_MILLISECONDS_IN_DAY < field) {
LAB_001e94de:
    iVar1 = (*(this->super_UObject)._vptr_UObject[0x14])(this,field);
    endValue = (*(this->super_UObject)._vptr_UObject[0x10])(this,field);
    iVar2 = getActualHelper(this,field,iVar1,endValue,status);
    return iVar2;
  }
  if ((0x35fe80U >> (field & (UCAL_DST_OFFSET|UCAL_ZONE_OFFSET)) & 1) != 0) {
    iVar1 = (*(this->super_UObject)._vptr_UObject[0x10])(this,field);
    return iVar1;
  }
  if (field == UCAL_DATE) {
    if (U_ZERO_ERROR < *status) {
      return 0;
    }
    iVar1 = (*(this->super_UObject)._vptr_UObject[3])(this);
    this_00 = (Calendar *)CONCAT44(extraout_var_00,iVar1);
    if (this_00 == (Calendar *)0x0) {
LAB_001e9512:
      *status = U_MEMORY_ALLOCATION_ERROR;
      goto LAB_001e9519;
    }
    this_00->fLenient = '\x01';
    uVar4 = 0;
    (*(this_00->super_UObject)._vptr_UObject[0x1e])(this_00,5,0,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      complete(this_00,status);
    }
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      uVar4 = this_00->fFields[0x13];
      complete(this_00,status);
    }
    uVar3 = 0;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      uVar3 = (ulong)(uint)this_00->fFields[2];
    }
    unaff_EBP = (*(this->super_UObject)._vptr_UObject[0x22])(this,(ulong)uVar4,uVar3);
  }
  else {
    if (field != UCAL_DAY_OF_YEAR) goto LAB_001e94de;
    if (U_ZERO_ERROR < *status) {
      return 0;
    }
    iVar1 = (*(this->super_UObject)._vptr_UObject[3])(this);
    this_00 = (Calendar *)CONCAT44(extraout_var,iVar1);
    if (this_00 == (Calendar *)0x0) goto LAB_001e9512;
    this_00->fLenient = '\x01';
    uVar4 = 0;
    (*(this_00->super_UObject)._vptr_UObject[0x1e])(this_00,6,0,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      complete(this_00,status);
    }
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      uVar4 = this_00->fFields[0x13];
    }
    unaff_EBP = (*(this->super_UObject)._vptr_UObject[0x23])(this,(ulong)uVar4);
  }
  (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
LAB_001e9519:
  if (this_00 != (Calendar *)0x0) {
    return unaff_EBP;
  }
  return 0;
}

Assistant:

int32_t
Calendar::getActualMaximum(UCalendarDateFields field, UErrorCode& status) const
{
    int32_t result;
    switch (field) {
    case UCAL_DATE:
        {
            if(U_FAILURE(status)) return 0;
            Calendar *cal = clone();
            if(!cal) { status = U_MEMORY_ALLOCATION_ERROR; return 0; }
            cal->setLenient(TRUE);
            cal->prepareGetActual(field,FALSE,status);
            result = handleGetMonthLength(cal->get(UCAL_EXTENDED_YEAR, status), cal->get(UCAL_MONTH, status));
            delete cal;
        }
        break;

    case UCAL_DAY_OF_YEAR:
        {
            if(U_FAILURE(status)) return 0;
            Calendar *cal = clone();
            if(!cal) { status = U_MEMORY_ALLOCATION_ERROR; return 0; }
            cal->setLenient(TRUE);
            cal->prepareGetActual(field,FALSE,status);
            result = handleGetYearLength(cal->get(UCAL_EXTENDED_YEAR, status));
            delete cal;
        }
        break;

    case UCAL_DAY_OF_WEEK:
    case UCAL_AM_PM:
    case UCAL_HOUR:
    case UCAL_HOUR_OF_DAY:
    case UCAL_MINUTE:
    case UCAL_SECOND:
    case UCAL_MILLISECOND:
    case UCAL_ZONE_OFFSET:
    case UCAL_DST_OFFSET:
    case UCAL_DOW_LOCAL:
    case UCAL_JULIAN_DAY:
    case UCAL_MILLISECONDS_IN_DAY:
        // These fields all have fixed minima/maxima
        result = getMaximum(field);
        break;

    default:
        // For all other fields, do it the hard way....
        result = getActualHelper(field, getLeastMaximum(field), getMaximum(field),status);
        break;
    }
    return result;
}